

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex_palette.c
# Opt level: O3

bool_t prf_vertex_palette_load_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  pool_t pool_id;
  uint8_t *puVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint uVar4;
  uint *puVar5;
  prf_nodeinfo_t *ppVar6;
  uint uVar7;
  uint uVar8;
  bool_t bVar9;
  prf_node_t subnode;
  prf_node_t local_58;
  
  uVar2 = bf_get_uint16_be(bfile);
  node->opcode = uVar2;
  if (uVar2 == prf_vertex_palette_info.opcode) {
    uVar2 = bf_get_int16_be(bfile);
    node->length = uVar2;
    uVar4 = bf_get_int32_be(bfile);
    puVar5 = (uint *)node->data;
    if ((int)uVar4 < 5) {
      *puVar5 = uVar4;
    }
    else {
      if (puVar5 == (uint *)0x0) {
        pool_id = state->model->mempool_id;
        if (pool_id == 0) {
          puVar5 = (uint *)malloc((ulong)uVar4);
        }
        else {
          puVar5 = (uint *)pool_malloc(pool_id,uVar4);
        }
        node->data = (uint8_t *)puVar5;
        if (puVar5 == (uint *)0x0) {
          prf_error(9,"memory allocation problem (returned NULL)");
          uVar4 = 8;
          goto LAB_0010ca81;
        }
      }
      *puVar5 = uVar4;
      if (uVar4 < 9) {
        return 1;
      }
      uVar7 = 8;
      do {
        uVar2 = bf_peek_uint16_be(bfile);
        ppVar6 = prf_nodeinfo_get(uVar2);
        if ((ppVar6 == (prf_nodeinfo_t *)0x0) ||
           (ppVar6->load_f == (_func_bool_t_prf_node_t_ptr_prf_state_t_ptr_bfile_t_ptr *)0x0)) {
          uVar2 = bf_get_uint16_be(bfile);
          uVar3 = bf_get_uint16_be(bfile);
          puVar1 = node->data;
          *(uint16_t *)(puVar1 + uVar7) = uVar2;
          *(uint16_t *)(puVar1 + (ulong)uVar7 + 2) = uVar3;
          uVar8 = (uint)uVar3;
          if (4 < uVar3) {
            bf_read(bfile,puVar1 + (ulong)uVar7 + 4,uVar3 - 4);
          }
        }
        else {
          bf_get_position(bfile);
          local_58.data = node->data + (ulong)uVar7 + 4;
          (*ppVar6->load_f)(&local_58,state,bfile);
          bf_get_position(bfile);
          puVar1 = node->data;
          *(uint16_t *)(puVar1 + uVar7) = local_58.opcode;
          uVar8 = (uint)local_58.length;
          *(uint16_t *)(puVar1 + (ulong)uVar7 + 2) = local_58.length;
          if ((4 < local_58.length) && (local_58.data != puVar1 + (ulong)uVar7 + 4)) {
            memcpy(puVar1 + (ulong)uVar7 + 4,local_58.data,(ulong)(local_58.length - 4));
            uVar8 = (uint)local_58.length;
          }
        }
        uVar7 = uVar7 + uVar8;
      } while ((int)uVar7 < (int)uVar4);
    }
    bVar9 = 1;
  }
  else {
    prf_error(9,"tried vertex palette load method on node of type %d.",(ulong)uVar2);
    uVar4 = 2;
LAB_0010ca81:
    bVar9 = 0;
    bf_rewind(bfile,uVar4);
  }
  return bVar9;
}

Assistant:

static
bool_t
prf_vertex_palette_load_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int32_t length;
    int curptr;
    prf_model_t fakemodel;
    node_data * vpdata;

    assert( node != NULL && state != NULL && bfile != NULL );
    
    fakemodel.header = NULL;
    fakemodel.mempool_id = 0;

    node->opcode = bf_get_uint16_be( bfile );
    if ( node->opcode != prf_vertex_palette_info.opcode ) {
        prf_error( 9, "tried vertex palette load method on node of type %d.",
            node->opcode );
        bf_rewind( bfile, 2 );
        return FALSE;
    }

    node->length = bf_get_int16_be( bfile );
    length = bf_get_int32_be( bfile );

    if ( length > 4 && node->data == NULL ) {
        assert( state->model != NULL );
        if ( state->model->mempool_id != 0 ) {
            node->data = (uint8_t *)pool_malloc( state->model->mempool_id, 
						 length );
        } else {
            node->data = (uint8_t *)malloc( length );
        }
        if ( node->data == NULL ) {
            prf_error( 9, "memory allocation problem (returned NULL)" );
            bf_rewind( bfile, 8 );
            return FALSE;
        }
    }
    vpdata = (node_data *) node->data;
    vpdata->length = length;

    /* four bytes are skipped */
    curptr = 8;
    while ( curptr < length ) {
        /* do it the hard - but general way */
        uint16_t opcode;
        prf_nodeinfo_t * subnodeinfo;
        prf_node_t subnode;

        opcode = bf_peek_uint16_be( bfile );
        subnodeinfo = prf_nodeinfo_get( opcode );
        if ( subnodeinfo != NULL && subnodeinfo->load_f != NULL ) {
            uint32_t oldpos, newpos;
            uint16_t * uint16ptr;

            oldpos = bf_get_position( bfile );
            subnode.data = node->data + curptr + 4;
            (*(subnodeinfo->load_f))( &subnode, state, bfile );
            newpos = bf_get_position( bfile );
            assert( (newpos - oldpos) == subnode.length );
            uint16ptr = (uint16_t *) (node->data + curptr);
            uint16ptr[0] = subnode.opcode;
            uint16ptr[1] = subnode.length;
            if ( (subnode.length > 4) &&
                (subnode.data != (node->data + curptr + 4)) ) {
                assert( subnode.data != NULL );
                memcpy( node->data + curptr + 4, subnode.data,
                    subnode.length - 4 );
            }
            curptr += subnode.length;
        } else {
            uint16_t nodelength;
            uint16_t * uint16ptr;
            opcode = bf_get_uint16_be( bfile ); /* opcode */
            nodelength = bf_get_uint16_be( bfile );
            uint16ptr = (uint16_t *) (node->data + curptr);
            uint16ptr[0] = opcode;
            uint16ptr[1] = nodelength;
            if ( nodelength > 4 )
                bf_read( bfile, node->data + curptr + 4, nodelength - 4 );
            curptr += nodelength;
        }
    }

    return TRUE;
}